

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environments.cpp
# Opt level: O1

bool fill_environment(shared_ptr<SchemeEnvironment> *env,shared_ptr<SchemePair> *np)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar3;
  SchemePair *__tmp;
  long lVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<SchemeObject> local_48;
  
  do {
    peVar1 = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    bVar3 = peVar1 == (element_type *)
                      scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            || peVar1 == (element_type *)0x0;
    if (bVar3) {
      return bVar3;
    }
    peVar2 = (peVar1->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(peVar2,&SchemeObject::typeinfo,&SchemeSymbol::typeinfo);
    }
    if (lVar4 == 0) {
      lVar4 = 0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (peVar1->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (lVar4 != 0) {
      local_48.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_48.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Context::set(&((env->super___shared_ptr<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->context,(string *)(lVar4 + 8),&local_48);
      if (local_48.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      peVar1 = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2 = (peVar1->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        peVar5 = (element_type *)0x0;
      }
      else {
        peVar5 = (element_type *)
                 __dynamic_cast(peVar2,&SchemeObject::typeinfo,&SchemePair::typeinfo);
      }
      if (peVar5 == (element_type *)0x0) {
        peVar5 = (element_type *)0x0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var6 = (peVar1->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
      }
      (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
      this = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var6;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  } while (lVar4 != 0);
  return bVar3;
}

Assistant:

static bool fill_environment(const std::shared_ptr<SchemeEnvironment> &env, std::shared_ptr<SchemePair> np)
{
    while(np && np != scheme_nil)
    {
        auto s = std::dynamic_pointer_cast<SchemeSymbol>(np->car);
        if(!s)
            return false;
        env->context.set(s->value, nullptr);
        np = std::dynamic_pointer_cast<SchemePair>(np->cdr);
    }
    return true;
}